

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  byte bVar1;
  char *pcVar2;
  undefined4 uVar3;
  ParseFlags parse_flags;
  int iVar4;
  ParseStatus PVar5;
  string *utf;
  Regexp *pRVar6;
  CharClassBuilder *pCVar7;
  UGroup *g;
  RegexpStatus *pRVar8;
  int iVar9;
  uint8 uVar10;
  Regexp *pRVar11;
  RegexpOp op;
  int iVar12;
  bool bVar13;
  StringPiece local_c8;
  Rune r;
  ulong uStack_b0;
  int hi;
  int lo;
  RegexpStatus *local_a0;
  ParseState ps;
  StringPiece local_68;
  RegexpStatus xstatus;
  
  xstatus.code_ = kRegexpSuccess;
  xstatus.error_arg_.ptr_ = (char *)0x0;
  xstatus.error_arg_.length_ = 0;
  xstatus.tmp_ = (string *)0x0;
  pRVar8 = status;
  if (status == (RegexpStatus *)0x0) {
    pRVar8 = &xstatus;
  }
  ps.whole_regexp_.ptr_ = s->ptr_;
  ps.whole_regexp_.length_ = s->length_;
  ps.whole_regexp_._12_4_ = *(undefined4 *)&s->field_0xc;
  ps.stacktop_ = (Regexp *)0x0;
  ps.ncap_ = 0;
  bVar13 = (global_flags & Latin1) == NoParseFlags;
  ps.rune_max_ = 0xff;
  if (bVar13) {
    ps.rune_max_ = 0x10ffff;
  }
  local_c8.ptr_ = s->ptr_;
  local_c8._8_8_ = *(undefined8 *)&s->length_;
  ps.flags_ = global_flags;
  ps.status_ = pRVar8;
  if (!bVar13) {
    utf = (string *)operator_new(0x20);
    (utf->_M_dataplus)._M_p = (pointer)&utf->field_2;
    utf->_M_string_length = 0;
    (utf->field_2)._M_local_buf[0] = '\0';
    ConvertLatin1ToUTF8(&local_c8,utf);
    RegexpStatus::set_tmp(pRVar8,utf);
    local_c8.ptr_ = (utf->_M_dataplus)._M_p;
    local_c8.length_ = (int)utf->_M_string_length;
  }
  if ((global_flags & Literal) == NoParseFlags) {
    local_a0 = status;
LAB_00123ceb:
    pRVar11 = (Regexp *)0x0;
    iVar12 = 0;
LAB_00123cf0:
    parse_flags = ps.flags_;
    pcVar2 = local_c8.ptr_;
    iVar9 = local_c8.length_;
    if (local_c8.length_ < 1) {
      pRVar6 = ParseState::DoFinish(&ps);
      goto LAB_00124310;
    }
    uVar10 = *(uint8 *)local_c8.ptr_;
    uVar3 = local_c8._12_4_;
    op = kRegexpStar;
    switch(uVar10) {
    case '$':
      ParseState::PushDollar(&ps);
      break;
    case '%':
    case '&':
    case '\'':
    case ',':
    case '-':
switchD_00123d1c_caseD_25:
      iVar12 = StringPieceToRune(&r,&local_c8,pRVar8);
      if (iVar12 < 0) goto LAB_0012430e;
      ParseState::PushLiteral(&ps,r);
      goto LAB_00123ceb;
    case '(':
      if ((local_c8.length_ != 1 && (ps.flags_ >> 9 & 1) != 0) &&
         (*(uint8 *)((long)local_c8.ptr_ + 1) == '?')) {
        bVar13 = ParseState::ParsePerlFlags(&ps,&local_c8);
        pRVar6 = (Regexp *)0x0;
        pRVar11 = (Regexp *)0x0;
        iVar12 = 0;
        if (!bVar13) goto LAB_00124310;
        goto LAB_00123cf0;
      }
      if ((ps.flags_ >> 0xc & 1) == 0) {
        _r = (Regexp *)0x0;
        uStack_b0 = uStack_b0 & 0xffffffff00000000;
        ParseState::DoLeftParen(&ps,(StringPiece *)&r);
      }
      else {
        ParseState::DoLeftParenNoCapture(&ps);
      }
      break;
    case ')':
      bVar13 = ParseState::DoRightParen(&ps);
      if (!bVar13) goto LAB_0012430e;
      break;
    case '*':
      goto switchD_00123d1c_caseD_2a;
    case '+':
      op = kRegexpPlus;
switchD_00123d1c_caseD_2a:
      _r = (Regexp *)local_c8.ptr_;
      uStack_b0 = local_c8._8_8_;
      pRVar6 = (Regexp *)((long)local_c8.ptr_ + 1);
      local_c8.length_ = local_c8.length_ + -1;
      if ((ps.flags_ & PerlX) == NoParseFlags) {
        bVar13 = false;
        local_c8.ptr_ = (char *)pRVar6;
      }
      else {
        if ((local_c8.length_ == 0) || (*(uint8 *)pRVar6 != '?')) {
          bVar13 = false;
        }
        else {
          pRVar6 = (Regexp *)((long)local_c8.ptr_ + 2);
          local_c8.length_ = iVar9 + -2;
          bVar13 = true;
        }
        local_c8.ptr_ = (char *)pRVar6;
        if (0 < iVar12) {
          pRVar8->code_ = kRegexpRepeatOp;
          pRVar8 = &xstatus;
          if (local_a0 != (RegexpStatus *)0x0) {
            pRVar8 = local_a0;
          }
          (pRVar8->error_arg_).ptr_ = (char *)pRVar11;
          (pRVar8->error_arg_).length_ = (int)pRVar6 - (int)pRVar11;
          goto LAB_0012430e;
        }
      }
      iVar12 = (int)local_c8.ptr_ - (int)pcVar2;
      uStack_b0 = CONCAT44(uVar3,iVar12);
      bVar13 = ParseState::PushRepeatOp(&ps,op,(StringPiece *)&r,bVar13);
      pRVar11 = (Regexp *)pcVar2;
joined_r0x001240e8:
      if (!bVar13) goto LAB_0012430e;
      goto LAB_00123cf0;
    case '.':
      ParseState::PushDot(&ps);
      break;
    default:
      goto switchD_00123d1c_default;
    }
LAB_001241b2:
    local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 1);
    local_c8.length_ = local_c8.length_ + -1;
    goto LAB_00123ceb;
  }
  while (0 < local_c8.length_) {
    iVar12 = StringPieceToRune(&r,&local_c8,pRVar8);
    if (iVar12 < 0) goto LAB_0012430e;
    ParseState::PushLiteral(&ps,r);
  }
  pRVar6 = ParseState::DoFinish(&ps);
LAB_00124310:
  ParseState::~ParseState(&ps);
  RegexpStatus::~RegexpStatus(&xstatus);
  return pRVar6;
switchD_00123d1c_default:
  if (uVar10 == '?') {
    op = kRegexpQuest;
    goto switchD_00123d1c_caseD_2a;
  }
  if (uVar10 == '[') {
    bVar13 = ParseState::ParseCharClass(&ps,&local_c8,(Regexp **)&r,pRVar8);
    if (!bVar13) goto LAB_0012430e;
    ParseState::PushRegexp(&ps,_r);
    goto LAB_00123ceb;
  }
  if (uVar10 != '\\') {
    if (uVar10 == '^') {
      ParseState::PushCarat(&ps);
      goto LAB_001241b2;
    }
    if (uVar10 != '{') {
      if (uVar10 != '|') goto switchD_00123d1c_caseD_25;
      ParseState::DoVerticalBar(&ps);
      goto LAB_001241b2;
    }
    local_68.ptr_ = local_c8.ptr_;
    local_68.length_ = local_c8.length_;
    local_68._12_4_ = local_c8._12_4_;
    _r = (Regexp *)local_c8.ptr_;
    uStack_b0 = local_c8._8_8_;
    if ((iVar9 == 0) || (*(uint8 *)local_c8.ptr_ != '{')) goto LAB_00123fe5;
    _r = (Regexp *)((long)local_c8.ptr_ + 1);
    uStack_b0 = CONCAT44(uVar3,iVar9 + -1);
    bVar13 = ParseInteger((StringPiece *)&r,&lo);
    if ((!bVar13) || ((int)uStack_b0 == 0)) goto LAB_00123fe5;
    uVar10 = _r->op_;
    iVar9 = (int)uStack_b0;
    iVar4 = lo;
    if (uVar10 == ',') {
      _r = (Regexp *)&_r->simple_;
      iVar9 = (int)uStack_b0 + -1;
      uStack_b0 = CONCAT44(uStack_b0._4_4_,iVar9);
      if (iVar9 == 0) goto LAB_00123fe5;
      uVar10 = '}';
      iVar4 = -1;
      if ((char)*(uint16 *)_r != '}') {
        bVar13 = ParseInteger((StringPiece *)&r,&hi);
        if ((int)uStack_b0 == 0 || !bVar13) goto LAB_00123fe5;
        uVar10 = (uint8)*(uint16 *)&_r->op_;
        iVar9 = (int)uStack_b0;
        iVar4 = hi;
      }
    }
    hi = iVar4;
    pcVar2 = local_68.ptr_;
    if (uVar10 != '}') goto LAB_00123fe5;
    local_c8.ptr_ = (char *)&_r->simple_;
    local_c8.length_ = iVar9 + -1;
    if ((ps.flags_ & PerlX) == NoParseFlags) {
      iVar9 = (int)local_c8.ptr_;
      bVar13 = false;
    }
    else {
      if ((iVar9 + -1 < 1) || (*local_c8.ptr_ != '?')) {
        bVar13 = false;
      }
      else {
        local_c8.ptr_ = (char *)&_r->parse_flags_;
        local_c8.length_ = iVar9 + -2;
        bVar13 = true;
      }
      iVar9 = (int)local_c8.ptr_;
      if (0 < iVar12) {
        pRVar8->code_ = kRegexpRepeatOp;
        pRVar8 = &xstatus;
        if (local_a0 != (RegexpStatus *)0x0) {
          pRVar8 = local_a0;
        }
        (pRVar8->error_arg_).ptr_ = (char *)pRVar11;
        (pRVar8->error_arg_).length_ = iVar9 - (int)pRVar11;
        goto LAB_0012430e;
      }
    }
    iVar12 = iVar9 - (int)local_68.ptr_;
    local_68.length_ = iVar12;
    bVar13 = ParseState::PushRepetition(&ps,lo,hi,&local_68,bVar13);
    pRVar11 = (Regexp *)pcVar2;
    goto joined_r0x001240e8;
  }
  if ((ps.flags_ >> 8 & 1) == 0) {
LAB_00123e5b:
    if ((ps.flags_ >> 9 & 1) == 0) {
      if (local_c8.length_ != 1) {
        bVar1 = *(uint8 *)((long)local_c8.ptr_ + 1);
LAB_00123e71:
        if ((bVar1 | 0x20) == 0x70) {
          pRVar6 = (Regexp *)operator_new(0x28);
          Regexp(pRVar6,kRegexpCharClass,parse_flags & ~FoldCase);
          pCVar7 = (CharClassBuilder *)operator_new(0x40);
          CharClassBuilder::CharClassBuilder(pCVar7);
          (pRVar6->field_7).field_3.ccb_ = pCVar7;
          PVar5 = ParseUnicodeGroup(&local_c8,parse_flags,pCVar7,pRVar8);
          if (PVar5 == kParseOk) {
            pRVar11 = (Regexp *)0x0;
            ParseState::PushRegexp(&ps,pRVar6);
            iVar12 = 0;
            goto LAB_00123cf0;
          }
          if (PVar5 == kParseNothing) {
            Decref(pRVar6);
          }
          else if (PVar5 == kParseError) {
            Decref(pRVar6);
            goto LAB_0012430e;
          }
        }
      }
    }
    else if (local_c8.length_ != 1) {
      bVar1 = *(uint8 *)((long)local_c8.ptr_ + 1);
      if (bVar1 == 0x7a) {
        ParseState::PushSimpleOp(&ps,kRegexpEndText);
      }
      else {
        if (bVar1 != 0x43) {
          if (bVar1 != 0x51) {
            if (bVar1 != 0x41) goto LAB_00123e71;
            ParseState::PushSimpleOp(&ps,kRegexpBeginText);
            goto LAB_001241fd;
          }
          local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 2);
          local_c8.length_ = local_c8.length_ + -2;
          iVar12 = local_c8.length_;
          goto LAB_0012421b;
        }
        ParseState::PushSimpleOp(&ps,kRegexpAnyByte);
      }
      goto LAB_001241fd;
    }
  }
  else if (local_c8.length_ != 1) {
    if ((*(uint8 *)((long)local_c8.ptr_ + 1) | 0x20) != 0x62) goto LAB_00123e5b;
    ParseState::PushWordBoundary(&ps,*(uint8 *)((long)local_c8.ptr_ + 1) == 0x62);
LAB_001241fd:
    local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 2);
    local_c8.length_ = local_c8.length_ + -2;
    goto LAB_00123ceb;
  }
  g = MaybeParsePerlCCEscape(&local_c8,parse_flags);
  if (g != (UGroup *)0x0) {
    pRVar6 = (Regexp *)operator_new(0x28);
    Regexp(pRVar6,kRegexpCharClass,parse_flags & ~FoldCase);
    pCVar7 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(pCVar7);
    (pRVar6->field_7).field_3.ccb_ = pCVar7;
    AddUGroup(pCVar7,g,g->sign,parse_flags);
    pRVar11 = (Regexp *)0x0;
    ParseState::PushRegexp(&ps,pRVar6);
    iVar12 = 0;
    goto LAB_00123cf0;
  }
  bVar13 = ParseEscape(&local_c8,&r,pRVar8,ps.rune_max_);
  if (!bVar13) goto LAB_0012430e;
  ParseState::PushLiteral(&ps,r);
  goto LAB_00123ceb;
LAB_00123fe5:
  ParseState::PushLiteral(&ps,0x7b);
  local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 1);
  local_c8.length_ = local_c8.length_ + -1;
  pRVar11 = (Regexp *)0x0;
  iVar12 = 0;
  goto LAB_00123cf0;
LAB_0012421b:
  if (iVar12 < 1) goto LAB_00123ceb;
  if (((iVar12 != 1) && (*(uint8 *)local_c8.ptr_ == '\\')) &&
     (*(uint8 *)((long)local_c8.ptr_ + 1) == 'E')) {
    local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 2);
    local_c8.length_ = iVar12 + -2;
    goto LAB_00123ceb;
  }
  iVar12 = StringPieceToRune(&r,&local_c8,pRVar8);
  if (iVar12 < 0) goto LAB_0012430e;
  ParseState::PushLiteral(&ps,r);
  iVar12 = local_c8.length_;
  goto LAB_0012421b;
LAB_0012430e:
  pRVar6 = (Regexp *)0x0;
  goto LAB_00124310;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    string* tmp = new string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (t.size() > 0) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = NULL;
  while (t.size() > 0) {
    StringPiece isunary = NULL;
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(NULL))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCarat())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (t.size() > 0) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}